

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySet.h
# Opt level: O1

void __thiscall
cmInstallRuntimeDependencySet::AddModule
          (cmInstallRuntimeDependencySet *this,cmInstallTargetGenerator *module)

{
  pointer *__ptr;
  __uniq_ptr_impl<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
  .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl =
       (tuple<cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
        )operator_new(0x10);
  *(undefined ***)
   local_18._M_t.
   super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
   .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl =
       &PTR__Item_0085ef90;
  *(cmInstallTargetGenerator **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
          .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl + 8) =
       module;
  AddModule(this,(unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
                  *)&local_18);
  if ((_Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
       )local_18._M_t.
        super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
        .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl !=
      (Item *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
                          .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>.
                          _M_head_impl + 8))();
  }
  return;
}

Assistant:

void AddModule(cmInstallTargetGenerator* module)
  {
    this->AddModule(cm::make_unique<TargetItem>(module));
  }